

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteGml.c
# Opt level: O1

void Io_WriteGml(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  long lVar8;
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteGml.c"
                  ,0x34,"void Io_WriteGml(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar5 = pNtk->pName;
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"# GML for \"%s\" written by ABC on %s\n",pcVar5,pcVar4);
    fwrite("graph [\n",8,1,__stream);
    fputc(10,__stream);
    pVVar6 = pNtk->vPos;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        uVar1 = ((Abc_Obj_t *)pVVar6->pArray[lVar7])->Id;
        pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar6->pArray[lVar7]);
        fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar5);
        fwrite("        graphics [ type \"triangle\" fill \"#00FFFF\" ]\n",0x34,1,__stream);
        fwrite("    ]\n",6,1,__stream);
        lVar7 = lVar7 + 1;
        pVVar6 = pNtk->vPos;
      } while (lVar7 < pVVar6->nSize);
    }
    fputc(10,__stream);
    pVVar6 = pNtk->vPis;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        uVar1 = ((Abc_Obj_t *)pVVar6->pArray[lVar7])->Id;
        pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar6->pArray[lVar7]);
        fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar5);
        fwrite("        graphics [ type \"triangle\" fill \"#00FF00\" ]\n",0x34,1,__stream);
        fwrite("    ]\n",6,1,__stream);
        lVar7 = lVar7 + 1;
        pVVar6 = pNtk->vPis;
      } while (lVar7 < pVVar6->nSize);
    }
    fputc(10,__stream);
    pVVar6 = pNtk->vBoxes;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar7];
        if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
          uVar1 = pAVar2->Id;
          pcVar5 = Abc_ObjName(pAVar2);
          fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar5);
          fwrite("        graphics [ type \"rectangle\" fill \"#FF0000\" ]\n",0x35,1,__stream);
          fwrite("    ]\n",6,1,__stream);
        }
        lVar7 = lVar7 + 1;
        pVVar6 = pNtk->vBoxes;
      } while (lVar7 < pVVar6->nSize);
    }
    fputc(10,__stream);
    pVVar6 = pNtk->vObjs;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar7];
        if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
          uVar1 = pAVar2->Id;
          pcVar5 = Abc_ObjName(pAVar2);
          fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar5);
          fwrite("        graphics [ type \"ellipse\" fill \"#CCCCFF\" ]\n",0x33,1,__stream);
          fwrite("    ]\n",6,1,__stream);
        }
        lVar7 = lVar7 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar7 < pVVar6->nSize);
    }
    fputc(10,__stream);
    pVVar6 = pNtk->vObjs;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        plVar3 = (long *)pVVar6->pArray[lVar7];
        if ((plVar3 != (long *)0x0) && (0 < *(int *)((long)plVar3 + 0x1c))) {
          lVar8 = 0;
          do {
            fprintf(__stream,"    edge [ source %5d   target %5d\n",(ulong)*(uint *)(plVar3 + 2),
                    (ulong)*(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                              (long)*(int *)(plVar3[4] + lVar8 * 4) * 8) + 0x10));
            fwrite("        graphics [ type \"line\" arrow \"first\" ]\n",0x2f,1,__stream);
            fwrite("    ]\n",6,1,__stream);
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)plVar3 + 0x1c));
        }
        lVar7 = lVar7 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar7 < pVVar6->nSize);
    }
    fwrite("]\n",2,1,__stream);
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  fprintf(_stdout,"Io_WriteGml(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the graph structure of AIG in GML.]

  Description [Useful for graph visualization using tools such as yEd: 
  http://www.yworks.com/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Io_WriteGml( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)  );

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteGml(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# GML for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    fprintf( pFile, "graph [\n" );

    // output the POs
    fprintf( pFile, "\n" );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"triangle\" fill \"#00FFFF\" ]\n" );   // blue
        fprintf( pFile, "    ]\n" );
    }
    // output the PIs
    fprintf( pFile, "\n" );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"triangle\" fill \"#00FF00\" ]\n" );   // green
        fprintf( pFile, "    ]\n" );
    }
    // output the latches
    fprintf( pFile, "\n" );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"rectangle\" fill \"#FF0000\" ]\n" );   // red
        fprintf( pFile, "    ]\n" );
    }
    // output the nodes
    fprintf( pFile, "\n" );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"ellipse\" fill \"#CCCCFF\" ]\n" );     // grey
        fprintf( pFile, "    ]\n" );
    }

    // output the edges
    fprintf( pFile, "\n" );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            fprintf( pFile, "    edge [ source %5d   target %5d\n", pObj->Id, pFanin->Id );
            fprintf( pFile, "        graphics [ type \"line\" arrow \"first\" ]\n" );
            fprintf( pFile, "    ]\n" );
        }
    }

    fprintf( pFile, "]\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );
}